

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_rom_writer.cpp
# Opt level: O2

void io::write_world_to_rom(World *world,ROM *rom)

{
  byte bVar1;
  byte bVar2;
  undefined2 uVar3;
  pointer ppMVar4;
  pointer ppBVar5;
  pointer ppIVar6;
  EnemyType *pEVar7;
  HuffmanTree *this;
  pointer pMVar8;
  pointer ppCVar9;
  ColorPalette<13UL> *pCVar10;
  pointer puVar11;
  pointer ppEVar12;
  uint8_t uVar13;
  bool bVar14;
  undefined2 uVar15;
  uint16_t uVar16;
  uint32_t uVar17;
  mapped_type_conflict1 *pmVar18;
  size_type sVar19;
  _Rb_tree_header *p_Var20;
  _Rb_tree_node_base *p_Var21;
  Code *pCVar22;
  _Base_ptr p_Var23;
  mapped_type_conflict2 *pmVar24;
  ulong uVar25;
  mapped_type *pmVar26;
  pointer ppEVar27;
  byte *pbVar28;
  long lVar29;
  ulong uVar30;
  array<Color,_6UL> *__one;
  LandstalkerException *pLVar31;
  _Base_ptr p_Var32;
  undefined1 uVar33;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Dinopony[P]randstalker_extlibs_landstalker_lib_landstalker_lib_io_world_rom_writer_cpp:178:9)>
  *__comp;
  long lVar34;
  undefined1 uVar35;
  mapped_type mVar37;
  size_t i;
  pointer ppIVar38;
  pointer pMVar39;
  MapPalette *__range2;
  pointer ppMVar40;
  MapLayout *pMVar41;
  pointer ppBVar42;
  __normal_iterator<EnemyType_**,_std::vector<EnemyType_*,_std::allocator<EnemyType_*>_>_> __last;
  ulong uVar43;
  byte bVar44;
  EntityLowPalette *palette;
  ColorPalette<6UL> *this_00;
  MapLayout *pMVar45;
  pointer ppCVar46;
  mapped_type_conflict2 mVar47;
  pointer puVar48;
  initializer_list<unsigned_char> __l;
  MapLayout *layout;
  MapLayout *pMStack_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368 [2];
  MapLayout *local_340;
  map<Blockset_*,_unsigned_int,_std::less<Blockset_*>,_std::allocator<std::pair<Blockset_*const,_unsigned_int>_>_>
  blockset_addresses;
  _Rb_tree_node_base local_2e8;
  size_t local_2c8;
  ByteArray blockset_group_bytes;
  Blockset *blockset;
  pointer puStack_280;
  _Base_ptr local_278;
  ByteArray bytes;
  _Base_ptr local_238;
  _Base_ptr p_Stack_230;
  _Base_ptr local_228;
  _Base_ptr p_Stack_220;
  size_t local_218;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_210;
  ByteArray blockset_bytes;
  vector<EnemyType_*,_std::allocator<EnemyType_*>_> enemy_types;
  _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
  local_188;
  ByteArray high_palettes_bytes;
  set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> drop_probabilities
  ;
  map<MapLayout_*,_unsigned_int,_std::less<MapLayout_*>,_std::allocator<std::pair<MapLayout_*const,_unsigned_int>_>_>
  map_layout_addresses;
  map<EnemyType_*,_unsigned_short,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
  instances_in_game;
  map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
  drop_probability_lookup;
  _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
  local_60;
  char cVar36;
  
  World::clean_unused_map_palettes(world);
  World::clean_unused_blocksets(world);
  World::clean_unused_layouts(world);
  md::ROM::mark_empty_chunk(rom,0xa2392,0x11c926);
  map_layout_addresses._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_layout_addresses._M_t._M_impl.super__Rb_tree_header._M_header;
  map_layout_addresses._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_layout_addresses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_layout_addresses._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppMVar4 = (world->_map_layouts).super__Vector_base<MapLayout_*,_std::allocator<MapLayout_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  map_layout_addresses._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_layout_addresses._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (ppMVar40 = (world->_map_layouts).
                  super__Vector_base<MapLayout_*,_std::allocator<MapLayout_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppMVar40 != ppMVar4; ppMVar40 = ppMVar40 + 1) {
    layout = *ppMVar40;
    encode_map_layout(&bytes,layout);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&blockset_addresses,"",(allocator<char> *)&blockset_group_bytes);
    uVar17 = md::ROM::inject_bytes
                       (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bytes,
                        (string *)&blockset_addresses);
    std::__cxx11::string::~string((string *)&blockset_addresses);
    pmVar18 = std::
              map<MapLayout_*,_unsigned_int,_std::less<MapLayout_*>,_std::allocator<std::pair<MapLayout_*const,_unsigned_int>_>_>
              ::operator[](&map_layout_addresses,&layout);
    *pmVar18 = uVar17;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bytes);
  }
  md::ROM::mark_empty_chunk(rom,0x1af804,0x1e0000);
  local_368[0]._M_allocated_capacity = (_Base_ptr)0x0;
  blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_header;
  blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (ulong)(uint)blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ << 0x20;
  blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  layout = (MapLayout *)0x0;
  pMStack_370 = (MapLayout *)0x0;
  blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pMVar45 = (MapLayout *)
            (world->_blockset_groups).
            super__Vector_base<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pMVar41 = (MapLayout *)
                 (world->_blockset_groups).
                 super__Vector_base<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pMVar41 != pMVar45;
      pMVar41 = (MapLayout *)
                &(pMVar41->_foreground_tiles).
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage) {
    blockset_group_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    blockset_group_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    blockset_group_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ppBVar5 = (pointer)(pMVar41->_foreground_tiles).
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start;
    local_340 = pMVar41;
    for (ppBVar42 = *(pointer *)pMVar41; ppBVar42 != ppBVar5; ppBVar42 = ppBVar42 + 1) {
      blockset = *ppBVar42;
      sVar19 = std::
               map<Blockset_*,_unsigned_int,_std::less<Blockset_*>,_std::allocator<std::pair<Blockset_*const,_unsigned_int>_>_>
               ::count(&blockset_addresses,&blockset);
      if (sVar19 == 0) {
        encode_blockset(&blockset_bytes,blockset);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&bytes,"",(allocator<char> *)&local_188);
        uVar17 = md::ROM::inject_bytes
                           (rom,&blockset_bytes.
                                 super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                            (string *)&bytes);
        pmVar18 = std::
                  map<Blockset_*,_unsigned_int,_std::less<Blockset_*>,_std::allocator<std::pair<Blockset_*const,_unsigned_int>_>_>
                  ::operator[](&blockset_addresses,&blockset);
        *pmVar18 = uVar17;
        std::__cxx11::string::~string((string *)&bytes);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&blockset_bytes);
      }
      pmVar18 = std::
                map<Blockset_*,_unsigned_int,_std::less<Blockset_*>,_std::allocator<std::pair<Blockset_*const,_unsigned_int>_>_>
                ::operator[](&blockset_addresses,&blockset);
      ByteArray::add_long(&blockset_group_bytes,*pmVar18);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bytes,"",(allocator<char> *)&blockset_bytes);
    uVar17 = md::ROM::inject_bytes
                       (rom,&blockset_group_bytes.
                             super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                        (string *)&bytes);
    pMVar41 = local_340;
    std::__cxx11::string::~string((string *)&bytes);
    ByteArray::add_long((ByteArray *)&layout,uVar17);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&blockset_group_bytes)
    ;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bytes,"",(allocator<char> *)&blockset_group_bytes);
  uVar17 = md::ROM::inject_bytes
                     (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&layout,
                      (string *)&bytes);
  std::__cxx11::string::~string((string *)&bytes);
  md::ROM::set_long(rom,0x1af800,uVar17);
  std::
  _Rb_tree<Blockset_*,_std::pair<Blockset_*const,_unsigned_int>,_std::_Select1st<std::pair<Blockset_*const,_unsigned_int>_>,_std::less<Blockset_*>,_std::allocator<std::pair<Blockset_*const,_unsigned_int>_>_>
  ::~_Rb_tree(&blockset_addresses._M_t);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&layout);
  md::ROM::mark_empty_chunk(rom,0x29732,0x29a0a);
  blockset_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  blockset_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  blockset_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p_Var21 = (world->_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var20 = &(world->_items)._M_t._M_impl.super__Rb_tree_header;
  do {
    if ((_Rb_tree_header *)p_Var21 == p_Var20) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&blockset_addresses,"",(allocator<char> *)&bytes);
      uVar17 = md::ROM::inject_bytes
                         (rom,&blockset_bytes.
                               super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                          (string *)&blockset_addresses);
      std::__cxx11::string::~string((string *)&blockset_addresses);
      blockset_addresses._M_t._M_impl._0_8_ = 0;
      blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)
           ((ulong)blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_header._M_right &
           0xffffffff00000000);
      blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_2e8._M_color = _S_red;
      local_2e8._M_parent = (_Base_ptr)0x0;
      local_2c8 = 0;
      bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)CONCAT71(bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish._1_7_,2);
      bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246c60;
      local_2e8._M_left = &local_2e8;
      local_2e8._M_right = &local_2e8;
      md::Code::lea((Code *)&blockset_addresses,uVar17,(AddressRegister *)&bytes);
      md::Code::jmp((Code *)&blockset_addresses,0x294b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bytes,"",(allocator<char> *)&layout);
      uVar17 = md::ROM::inject_code(rom,(Code *)&blockset_addresses,(string *)&bytes);
      std::__cxx11::string::~string((string *)&bytes);
      local_218 = 0;
      _Stack_210._0_8_ = 0;
      local_238 = (_Base_ptr)0x0;
      p_Stack_230 = (_Base_ptr)0x0;
      bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      _Stack_210.super__Rb_tree_header._M_header._M_color = _S_red;
      _Stack_210.super__Rb_tree_header._M_header._4_4_ = 0;
      _Stack_210.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _Stack_210.super__Rb_tree_header._M_header._M_left =
           &_Stack_210.super__Rb_tree_header._M_header;
      _Stack_210.super__Rb_tree_header._M_node_count = 0;
      local_228 = (_Base_ptr)&local_238;
      p_Stack_220 = (_Base_ptr)&local_238;
      _Stack_210.super__Rb_tree_header._M_header._M_right =
           _Stack_210.super__Rb_tree_header._M_header._M_left;
      pCVar22 = md::Code::jmp((Code *)&bytes,uVar17);
      md::ROM::set_code(rom,0x294a2,pCVar22);
      md::Code::~Code((Code *)&bytes);
      md::Code::~Code((Code *)&blockset_addresses);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&blockset_bytes);
      layout = (MapLayout *)0x0;
      pMStack_370 = (MapLayout *)0x0;
      local_368[0]._M_allocated_capacity = (_Base_ptr)0x0;
      for (p_Var23 = (world->_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var23 != p_Var20;
          p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23)) {
        ByteArray::add_byte((ByteArray *)&layout,
                            *(char *)((long)&p_Var23[1]._M_parent[1]._M_left + 4) * '\x10' +
                            *(char *)&p_Var23[1]._M_parent[1]._M_left);
        ByteArray::add_byte((ByteArray *)&layout,0xff);
        ByteArray::add_word((ByteArray *)&layout,
                            *(uint16_t *)((long)&p_Var23[1]._M_parent[1]._M_left + 2));
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&blockset_addresses,"",(allocator<char> *)&bytes);
      uVar17 = md::ROM::inject_bytes
                         (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&layout,
                          (string *)&blockset_addresses);
      std::__cxx11::string::~string((string *)&blockset_addresses);
      blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      blockset_addresses._M_t._M_impl._0_8_ = 0;
      blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)
           ((ulong)blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_header._M_right &
           0xffffffff00000000);
      blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_2e8._M_color = _S_red;
      local_2e8._M_parent = (_Base_ptr)0x0;
      local_2c8 = 0;
      bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((ulong)bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246c60;
      local_2e8._M_left = &local_2e8;
      local_2e8._M_right = &local_2e8;
      md::Code::lea((Code *)&blockset_addresses,uVar17,(AddressRegister *)&bytes);
      blockset_group_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((ulong)blockset_group_bytes.
                            super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      blockset_group_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246c60;
      blockset_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((ulong)blockset_bytes.
                            super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      blockset_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246bf0;
      bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246d68;
      bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&blockset_group_bytes;
      bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&blockset_bytes;
      puStack_280 = (pointer)((ulong)puStack_280 & 0xffffffffffffff00);
      blockset = (Blockset *)&PTR_getXn_00246c60;
      md::Code::lea((Code *)&blockset_addresses,(Param *)&bytes,(AddressRegister *)&blockset);
      md::Code::add_word((Code *)&blockset_addresses,0x201f);
      md::Code::rts((Code *)&blockset_addresses);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bytes,"",(allocator<char> *)&blockset_group_bytes);
      uVar17 = md::ROM::inject_code(rom,(Code *)&blockset_addresses,(string *)&bytes);
      std::__cxx11::string::~string((string *)&bytes);
      local_218 = 0;
      _Stack_210._0_8_ = 0;
      local_238 = (_Base_ptr)0x0;
      p_Stack_230 = (_Base_ptr)0x0;
      bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      _Stack_210.super__Rb_tree_header._M_header._M_color = _S_red;
      _Stack_210.super__Rb_tree_header._M_header._4_4_ = 0;
      _Stack_210.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _Stack_210.super__Rb_tree_header._M_header._M_left =
           &_Stack_210.super__Rb_tree_header._M_header;
      _Stack_210.super__Rb_tree_header._M_node_count = 0;
      local_228 = (_Base_ptr)&local_238;
      p_Stack_220 = (_Base_ptr)&local_238;
      _Stack_210.super__Rb_tree_header._M_header._M_right =
           _Stack_210.super__Rb_tree_header._M_header._M_left;
      pCVar22 = md::Code::jmp((Code *)&bytes,uVar17);
      md::ROM::set_code(rom,0x292fc,pCVar22);
      md::Code::~Code((Code *)&bytes);
      md::Code::~Code((Code *)&blockset_addresses);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&layout);
      if (0x800 < (ulong)((long)(world->_chest_contents).
                                super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(world->_chest_contents).
                               super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                               super__Vector_impl_data._M_start)) {
        pLVar31 = (LandstalkerException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&blockset_addresses,"Cannot declare more than 256 chests",
                   (allocator<char> *)&bytes);
        LandstalkerException::LandstalkerException(pLVar31,(string *)&blockset_addresses);
        __cxa_throw(pLVar31,&LandstalkerException::typeinfo,
                    LandstalkerException::~LandstalkerException);
      }
      md::ROM::mark_empty_chunk(rom,0x9eabe,0x9eb9c);
      local_368[0]._M_allocated_capacity = (_Base_ptr)0x0;
      layout = (MapLayout *)0x0;
      pMStack_370 = (MapLayout *)0x0;
      ppIVar6 = (world->_chest_contents).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl
                .super__Vector_impl_data._M_finish;
      for (ppIVar38 = (world->_chest_contents).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppIVar38 != ppIVar6;
          ppIVar38 = ppIVar38 + 1) {
        if (*ppIVar38 == (Item *)0x0) {
          uVar13 = '?';
        }
        else {
          uVar13 = (*ppIVar38)->_id;
        }
        ByteArray::add_byte((ByteArray *)&layout,uVar13);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&blockset_addresses,"",(allocator<char> *)&bytes);
      uVar17 = md::ROM::inject_bytes
                         (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&layout,
                          (string *)&blockset_addresses);
      std::__cxx11::string::~string((string *)&blockset_addresses);
      blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      blockset_addresses._M_t._M_impl._0_8_ = 0;
      blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)
           ((ulong)blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_header._M_right &
           0xffffffff00000000);
      blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_2e8._M_color = _S_red;
      local_2e8._M_parent = (_Base_ptr)0x0;
      local_2c8 = 0;
      bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((ulong)bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246c60;
      local_2e8._M_left = &local_2e8;
      local_2e8._M_right = &local_2e8;
      md::Code::lea((Code *)&blockset_addresses,uVar17,(AddressRegister *)&bytes);
      blockset_group_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((ulong)blockset_group_bytes.
                            super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      blockset_group_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246c60;
      blockset_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)CONCAT71(blockset_bytes.
                             super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish._1_7_,1);
      blockset_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246bf0;
      bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246d68;
      bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&blockset_group_bytes;
      bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&blockset_bytes;
      puStack_280 = (pointer)((ulong)puStack_280 & 0xffffffffffffff00);
      blockset = (Blockset *)&PTR_getXn_00246bf0;
      md::Code::moveb((Code *)&blockset_addresses,(Param *)&bytes,(Param *)&blockset);
      md::Code::rts((Code *)&blockset_addresses);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bytes,"",(allocator<char> *)&blockset_group_bytes);
      uVar17 = md::ROM::inject_code(rom,(Code *)&blockset_addresses,(string *)&bytes);
      std::__cxx11::string::~string((string *)&bytes);
      local_218 = 0;
      _Stack_210._0_8_ = 0;
      local_238 = (_Base_ptr)0x0;
      p_Stack_230 = (_Base_ptr)0x0;
      bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      _Stack_210.super__Rb_tree_header._M_header._M_color = _S_red;
      _Stack_210.super__Rb_tree_header._M_header._4_4_ = 0;
      _Stack_210.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _Stack_210.super__Rb_tree_header._M_header._M_left =
           &_Stack_210.super__Rb_tree_header._M_header;
      _Stack_210.super__Rb_tree_header._M_node_count = 0;
      local_228 = (_Base_ptr)&local_238;
      p_Stack_220 = (_Base_ptr)&local_238;
      _Stack_210.super__Rb_tree_header._M_header._M_right =
           _Stack_210.super__Rb_tree_header._M_header._M_left;
      pCVar22 = md::Code::jsr((Code *)&bytes,uVar17);
      md::ROM::set_code(rom,0x9e776,pCVar22);
      md::Code::~Code((Code *)&bytes);
      md::Code::~Code((Code *)&blockset_addresses);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&layout);
      enemy_types.super__Vector_base<EnemyType_*,_std::allocator<EnemyType_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      drop_probabilities._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &drop_probabilities._M_t._M_impl.super__Rb_tree_header._M_header;
      drop_probabilities._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      drop_probabilities._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      drop_probabilities._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      drop_probability_lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &drop_probability_lookup._M_t._M_impl.super__Rb_tree_header._M_header;
      drop_probability_lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      drop_probability_lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      drop_probability_lookup._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      instances_in_game._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &instances_in_game._M_t._M_impl.super__Rb_tree_header._M_header;
      instances_in_game._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      instances_in_game._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      instances_in_game._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      enemy_types.super__Vector_base<EnemyType_*,_std::allocator<EnemyType_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      enemy_types.super__Vector_base<EnemyType_*,_std::allocator<EnemyType_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_340 = (MapLayout *)&(world->_entity_types)._M_t._M_impl.super__Rb_tree_header;
      drop_probabilities._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           drop_probabilities._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      instances_in_game._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           instances_in_game._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      drop_probability_lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           drop_probability_lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (p_Var23 = (world->_entity_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          ppEVar27 = enemy_types.super__Vector_base<EnemyType_*,_std::allocator<EnemyType_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
          ppEVar12 = enemy_types.super__Vector_base<EnemyType_*,_std::allocator<EnemyType_*>_>.
                     _M_impl.super__Vector_impl_data._M_start, (MapLayout *)p_Var23 != local_340;
          p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23)) {
        (*(code *)**(undefined8 **)p_Var23[1]._M_parent)((Code *)&blockset_addresses);
        bVar14 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&blockset_addresses,"enemy");
        std::__cxx11::string::~string((string *)&blockset_addresses);
        if (bVar14) {
          blockset_addresses._M_t._M_impl._0_8_ = p_Var23[1]._M_parent;
          std::vector<EnemyType*,std::allocator<EnemyType*>>::emplace_back<EnemyType*&>
                    ((vector<EnemyType*,std::allocator<EnemyType*>> *)&enemy_types,
                     (EnemyType **)&blockset_addresses);
          uVar15 = 1;
          if (*(char *)(blockset_addresses._M_t._M_impl._0_8_ + 0x72) == '\0') {
            uVar15 = *(undefined2 *)(blockset_addresses._M_t._M_impl._0_8_ + 0x70);
          }
          bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT62(bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._2_6_,uVar15);
          std::
          _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
          ::_M_insert_unique<unsigned_short>(&drop_probabilities._M_t,(unsigned_short *)&bytes);
          mVar47 = 0;
          for (p_Var21 = (world->_maps)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var21 != &(world->_maps)._M_t._M_impl.super__Rb_tree_header;
              p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21)) {
            for (p_Var32 = p_Var21[1]._M_parent[1]._M_left;
                p_Var32 != p_Var21[1]._M_parent[1]._M_right;
                p_Var32 = (_Base_ptr)&p_Var32->_M_parent) {
              mVar47 = mVar47 + (**(char **)p_Var32 == *(char *)&(p_Var23[1]._M_parent)->_M_parent);
            }
          }
          pmVar24 = std::
                    map<EnemyType_*,_unsigned_short,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                    ::operator[](&instances_in_game,(key_type *)&blockset_addresses);
          *pmVar24 = mVar47;
        }
      }
      std::
      _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
      ::_Rb_tree(&local_60,&instances_in_game._M_t);
      std::
      _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
      ::_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                  *)&high_palettes_bytes,&local_60);
      p_Var20 = &blockset_addresses._M_t._M_impl.super__Rb_tree_header;
      std::_Rb_tree_header::_Rb_tree_header
                (p_Var20,(_Rb_tree_header *)
                         &high_palettes_bytes.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish);
      std::_Rb_tree_header::_Rb_tree_header(&local_188._M_impl.super__Rb_tree_header,p_Var20);
      std::
      _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
      ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                   *)&blockset_addresses);
      if (ppEVar12 != ppEVar27) {
        std::
        _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
        ::_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                    *)&blockset_bytes,&local_188);
        uVar25 = (long)ppEVar27 - (long)ppEVar12 >> 3;
        lVar29 = 0x3f;
        if (uVar25 != 0) {
          for (; uVar25 >> lVar29 == 0; lVar29 = lVar29 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<EnemyType**,std::vector<EnemyType*,std::allocator<EnemyType*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<write_entity_types(World_const&,md::ROM&)::__0>>
                  ((__normal_iterator<EnemyType_**,_std::vector<EnemyType_*,_std::allocator<EnemyType_*>_>_>
                    )ppEVar12,
                   (__normal_iterator<EnemyType_**,_std::vector<EnemyType_*,_std::allocator<EnemyType_*>_>_>
                    )ppEVar27,(ulong)(((uint)lVar29 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Dinopony[P]randstalker_extlibs_landstalker_lib_landstalker_lib_io_world_rom_writer_cpp:178:9)>
                    *)&blockset_bytes);
        std::
        _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
        ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                     *)&blockset_bytes);
        std::
        _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
        ::_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                    *)&blockset,&local_188);
        if ((long)ppEVar27 - (long)ppEVar12 < 0x81) {
          __comp = (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Dinopony[P]randstalker_extlibs_landstalker_lib_landstalker_lib_io_world_rom_writer_cpp:178:9)>
                    *)&blockset_addresses;
          std::
          _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
          ::_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                      *)__comp,
                     (_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                      *)&blockset);
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<EnemyType**,std::vector<EnemyType*,std::allocator<EnemyType*>>>,__gnu_cxx::__ops::_Iter_comp_iter<write_entity_types(World_const&,md::ROM&)::__0>>
                    ((__normal_iterator<EnemyType_**,_std::vector<EnemyType_*,_std::allocator<EnemyType_*>_>_>
                      )ppEVar12,
                     (__normal_iterator<EnemyType_**,_std::vector<EnemyType_*,_std::allocator<EnemyType_*>_>_>
                      )ppEVar27,__comp);
        }
        else {
          std::
          _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
          ::_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                      *)&layout,
                     (_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                      *)&blockset);
          __last._M_current = ppEVar12 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<EnemyType**,std::vector<EnemyType*,std::allocator<EnemyType*>>>,__gnu_cxx::__ops::_Iter_comp_iter<write_entity_types(World_const&,md::ROM&)::__0>>
                    ((__normal_iterator<EnemyType_**,_std::vector<EnemyType_*,_std::allocator<EnemyType_*>_>_>
                      )ppEVar12,__last,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Dinopony[P]randstalker_extlibs_landstalker_lib_landstalker_lib_io_world_rom_writer_cpp:178:9)>
                      *)&layout);
          std::
          _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
          ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                       *)&layout);
          std::
          _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
          ::_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                      *)&blockset_group_bytes,
                     (_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                      *)&blockset);
          for (; __last._M_current != ppEVar27; __last._M_current = __last._M_current + 1) {
            std::
            _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
            ::_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                        *)&bytes,
                       (_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                        *)&blockset_group_bytes);
            std::_Rb_tree_header::_Rb_tree_header
                      (&blockset_addresses._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_header *)
                       &bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish);
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<EnemyType**,std::vector<EnemyType*,std::allocator<EnemyType*>>>,__gnu_cxx::__ops::_Val_comp_iter<write_entity_types(World_const&,md::ROM&)::__0>>
                      (__last,(_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Dinopony[P]randstalker_extlibs_landstalker_lib_landstalker_lib_io_world_rom_writer_cpp:178:9)>
                               *)&blockset_addresses);
            std::
            _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
            ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                         *)&blockset_addresses);
            std::
            _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
            ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                         *)&bytes);
          }
          __comp = (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Dinopony[P]randstalker_extlibs_landstalker_lib_landstalker_lib_io_world_rom_writer_cpp:178:9)>
                    *)&blockset_group_bytes;
        }
        std::
        _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
        ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                     *)__comp);
        std::
        _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
        ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                     *)&blockset);
      }
      std::
      _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
      ::~_Rb_tree(&local_188);
      std::
      _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
      ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                   *)&high_palettes_bytes);
      std::
      _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
      ::~_Rb_tree(&local_60);
      if (8 < drop_probabilities._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        pLVar31 = (LandstalkerException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&blockset_addresses,
                   "Having more than 8 different loot probabilities is not allowed",
                   (allocator<char> *)&bytes);
        LandstalkerException::LandstalkerException(pLVar31,(string *)&blockset_addresses);
        __cxa_throw(pLVar31,&LandstalkerException::typeinfo,
                    LandstalkerException::~LandstalkerException);
      }
      uVar17 = 0x199d6;
      mVar37 = '\0';
      p_Var23 = drop_probabilities._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while (ppEVar12 = enemy_types.super__Vector_base<EnemyType_*,_std::allocator<EnemyType_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish,
            (_Rb_tree_header *)p_Var23 != &drop_probabilities._M_t._M_impl.super__Rb_tree_header) {
        blockset_addresses._M_t._M_impl._0_2_ = (short)p_Var23[1]._M_color;
        pmVar26 = std::
                  map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
                  ::operator[](&drop_probability_lookup,(key_type *)&blockset_addresses);
        *pmVar26 = mVar37;
        md::ROM::set_word(rom,uVar17,blockset_addresses._M_t._M_impl._0_2_);
        uVar17 = uVar17 + 2;
        p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
        mVar37 = mVar37 + '\x01';
      }
      uVar17 = 0x1b6f0;
      for (ppEVar27 = enemy_types.super__Vector_base<EnemyType_*,_std::allocator<EnemyType_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppEVar27 != ppEVar12;
          ppEVar27 = ppEVar27 + 1) {
        pEVar7 = *ppEVar27;
        bVar44 = 0x3f;
        if (pEVar7->_unkillable == false) {
          bVar44 = pEVar7->_dropped_item->_id & 0x3f;
        }
        uVar16 = 1;
        if (pEVar7->_unkillable == false) {
          uVar16 = pEVar7->_drop_probability;
        }
        bVar1 = (pEVar7->super_EntityType).field_0x65;
        blockset_addresses._M_t._M_impl._0_2_ = uVar16;
        pbVar28 = std::
                  map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
                  ::at(&drop_probability_lookup,(key_type *)&blockset_addresses);
        bVar2 = *pbVar28;
        md::ROM::set_byte(rom,uVar17,(pEVar7->super_EntityType)._id);
        md::ROM::set_byte(rom,uVar17 + 1,(pEVar7->super_EntityType).field_0x64);
        md::ROM::set_byte(rom,uVar17 + 2,(pEVar7->super_EntityType).field_0x66);
        uVar13 = (pEVar7->super_EntityType).field_0x67;
        if (pEVar7->_unkillable != false) {
          uVar13 = '\0';
        }
        md::ROM::set_byte(rom,uVar17 + 3,uVar13);
        md::ROM::set_byte(rom,uVar17 + 4,(bVar2 & 4) << 5 | bVar1 & 0x7f);
        md::ROM::set_byte(rom,uVar17 + 5,bVar2 << 6 | bVar44);
        uVar17 = uVar17 + 6;
      }
      md::ROM::set_word(rom,uVar17,0xffff);
      if (uVar17 - 0x1b931 < 0xfffe46cd) {
        pLVar31 = (LandstalkerException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&blockset_addresses,"Enemy stats table is bigger than in original game"
                   ,(allocator<char> *)&bytes);
        LandstalkerException::LandstalkerException(pLVar31,(string *)&blockset_addresses);
        __cxa_throw(pLVar31,&LandstalkerException::typeinfo,
                    LandstalkerException::~LandstalkerException);
      }
      std::
      _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
      ::~_Rb_tree(&instances_in_game._M_t);
      std::
      _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_unsigned_char>,_std::_Select1st<std::pair<const_unsigned_short,_unsigned_char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
      ::~_Rb_tree(&drop_probability_lookup._M_t);
      std::
      _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
      ::~_Rb_tree(&drop_probabilities._M_t);
      std::_Vector_base<EnemyType_*,_std::allocator<EnemyType_*>_>::~_Vector_base
                (&enemy_types.super__Vector_base<EnemyType_*,_std::allocator<EnemyType_*>_>);
      bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      layout = (MapLayout *)0x0;
      pMStack_370 = (MapLayout *)0x0;
      local_368[0]._M_allocated_capacity = (_Base_ptr)0x0;
      blockset_group_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      blockset_group_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      blockset_group_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      p_Var23 = (world->_entity_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        if ((MapLayout *)p_Var23 == local_340) {
          ByteArray::add_word(&blockset_group_bytes,0xffff);
          if (0x2a6 < (ulong)((long)blockset_group_bytes.
                                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)blockset_group_bytes.
                                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)) {
            pLVar31 = (LandstalkerException *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&blockset_addresses,
                       "Entity palette uses table must not be bigger than the one from base game",
                       (allocator<char> *)&blockset_bytes);
            LandstalkerException::LandstalkerException(pLVar31,(string *)&blockset_addresses);
            __cxa_throw(pLVar31,&LandstalkerException::typeinfo,
                        LandstalkerException::~LandstalkerException);
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (&blockset_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                     &blockset_group_bytes.
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
          md::ROM::set_bytes(rom,0x1a453a,
                             &blockset_bytes.
                              super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&blockset_bytes)
          ;
          puVar11 = bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          local_278 = (_Base_ptr)0x0;
          blockset = (Blockset *)0x0;
          puStack_280 = (pointer)0x0;
          for (this_00 = (ColorPalette<6UL> *)
                         bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start; this_00 != (ColorPalette<6UL> *)puVar11;
              this_00 = this_00 + 1) {
            ColorPalette<6UL>::to_bytes((ByteArray *)&blockset_addresses,this_00);
            ByteArray::add_bytes
                      ((ByteArray *)&blockset,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&blockset_addresses)
            ;
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &blockset_addresses);
          }
          if ((ulong)((long)puStack_280 - (long)blockset) < 0x3c1) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&blockset);
            md::ROM::set_bytes(rom,0x1a47e0,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188);
            pMVar41 = pMStack_370;
            high_palettes_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            high_palettes_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            high_palettes_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            for (pMVar45 = layout; pMVar45 != pMVar41;
                pMVar45 = (MapLayout *)
                          ((long)&(pMVar45->_foreground_tiles).
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)) {
              ColorPalette<7UL>::to_bytes
                        ((ByteArray *)&blockset_addresses,(ColorPalette<7UL> *)pMVar45);
              ByteArray::add_bytes
                        (&high_palettes_bytes,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &blockset_addresses);
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &blockset_addresses);
            }
            if ((ulong)((long)high_palettes_bytes.
                              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)high_palettes_bytes.
                             super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start) < 0xef) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &blockset_addresses,
                         &high_palettes_bytes.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
              md::ROM::set_bytes(rom,0x1a4ba0,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &blockset_addresses);
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &blockset_addresses);
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &high_palettes_bytes);
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&blockset);
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &blockset_group_bytes);
              std::_Vector_base<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_>::
              ~_Vector_base((_Vector_base<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_> *)
                            &layout);
              std::_Vector_base<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_>::
              ~_Vector_base((_Vector_base<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_> *)
                            &bytes);
              build_trees_from_strings
                        ((vector<HuffmanTree_*,_std::allocator<HuffmanTree_*>_> *)
                         &blockset_group_bytes,&world->_game_strings);
              encode_huffman_trees
                        (&blockset_bytes,
                         (vector<HuffmanTree_*,_std::allocator<HuffmanTree_*>_> *)
                         &blockset_group_bytes);
              if ((ulong)((long)blockset_bytes.
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)blockset_bytes.
                               super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start) < 0x93d) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                          (&bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                           &blockset_bytes.
                            super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
                md::ROM::set_bytes(rom,0x23d60,
                                   &bytes.
                                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
                std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                          ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bytes);
                md::ROM::mark_empty_chunk(rom,0x2b27a,0x38600);
                encode_textbanks((vector<ByteArray,_std::allocator<ByteArray>_> *)&layout,
                                 &world->_game_strings,
                                 (vector<HuffmanTree_*,_std::allocator<HuffmanTree_*>_> *)
                                 &blockset_group_bytes);
                pMVar41 = pMStack_370;
                blockset = (Blockset *)0x0;
                puStack_280 = (pointer)0x0;
                local_278 = (_Base_ptr)0x0;
                for (pMVar45 = layout; pMVar45 != pMVar41;
                    pMVar45 = (MapLayout *)
                              &(pMVar45->_foreground_tiles).
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&blockset_addresses,"",(allocator<char> *)&local_188);
                  uVar17 = md::ROM::inject_bytes
                                     (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          pMVar45,(string *)&blockset_addresses);
                  std::__cxx11::string::~string((string *)&blockset_addresses);
                  ByteArray::add_long((ByteArray *)&blockset,uVar17);
                }
                ByteArray::add_long((ByteArray *)&blockset,0xffffffff);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&blockset_addresses,"",(allocator<char> *)&local_188);
                uVar17 = md::ROM::inject_bytes
                                   (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        &blockset,(string *)&blockset_addresses);
                std::__cxx11::string::~string((string *)&blockset_addresses);
                md::ROM::set_long(rom,0x22e80,uVar17);
                puVar11 = blockset_group_bytes.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                for (puVar48 = blockset_group_bytes.
                               super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start; puVar48 != puVar11;
                    puVar48 = puVar48 + 8) {
                  this = *(HuffmanTree **)puVar48;
                  if (this != (HuffmanTree *)0x0) {
                    HuffmanTree::~HuffmanTree(this);
                  }
                  operator_delete(this,0x38);
                }
                std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                          ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&blockset)
                ;
                std::vector<ByteArray,_std::allocator<ByteArray>_>::~vector
                          ((vector<ByteArray,_std::allocator<ByteArray>_> *)&layout);
                std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                          ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &blockset_bytes);
                std::_Vector_base<HuffmanTree_*,_std::allocator<HuffmanTree_*>_>::~_Vector_base
                          ((_Vector_base<HuffmanTree_*,_std::allocator<HuffmanTree_*>_> *)
                           &blockset_group_bytes);
                bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                pMVar8 = (world->_map_connections).
                         super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                for (pMVar39 = (world->_map_connections).
                               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>.
                               _M_impl.super__Vector_impl_data._M_start; pMVar39 != pMVar8;
                    pMVar39 = pMVar39 + 1) {
                  uVar15._0_1_ = pMVar39->_pos_x_1;
                  uVar15._1_1_ = pMVar39->_pos_y_1;
                  uVar3._0_1_ = pMVar39->_pos_x_2;
                  uVar3._1_1_ = pMVar39->_pos_y_2;
                  layout = (MapLayout *)
                           CONCAT26(uVar3,CONCAT15((char)pMVar39->_map_id_2,
                                                   CONCAT14(pMVar39->_extra_byte_2 << 2 |
                                                            (byte)(pMVar39->_map_id_2 >> 8) & 3,
                                                            CONCAT22(uVar15,CONCAT11((char)pMVar39->
                                                  _map_id_1,
                                                  pMVar39->_extra_byte_1 << 2 |
                                                  (byte)(pMVar39->_map_id_1 >> 8) & 3)))));
                  __l._M_len = 8;
                  __l._M_array = (iterator)&layout;
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &blockset_addresses,__l,(allocator_type *)&blockset_group_bytes);
                  ByteArray::add_bytes
                            (&bytes,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    &blockset_addresses);
                  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &blockset_addresses);
                }
                ByteArray::add_word(&bytes,0xffff);
                md::ROM::mark_empty_chunk(rom,0x11cea2,0x11ea64);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&blockset_addresses,"",(allocator<char> *)&layout);
                uVar17 = md::ROM::inject_bytes
                                   (rom,&bytes.
                                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                    ,(string *)&blockset_addresses);
                std::__cxx11::string::~string((string *)&blockset_addresses);
                md::ROM::set_long(rom,0xa0a08,uVar17);
                std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                          ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bytes);
                bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                ppCVar9 = (world->_map_palettes).
                          super__Vector_base<ColorPalette<13UL>_*,_std::allocator<ColorPalette<13UL>_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                for (ppCVar46 = (world->_map_palettes).
                                super__Vector_base<ColorPalette<13UL>_*,_std::allocator<ColorPalette<13UL>_*>_>
                                ._M_impl.super__Vector_impl_data._M_start; ppCVar46 != ppCVar9;
                    ppCVar46 = ppCVar46 + 1) {
                  pCVar10 = *ppCVar46;
                  for (lVar29 = 0; lVar29 != 0x34; lVar29 = lVar29 + 4) {
                    uVar16 = Color::to_bgr_word((Color *)(&(pCVar10->super_array<Color,_13UL>).
                                                           _M_elems[0]._r + lVar29));
                    ByteArray::add_word(&bytes,uVar16);
                  }
                }
                md::ROM::mark_empty_chunk(rom,0x11c926,0x11cea2);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&blockset_addresses,"",(allocator<char> *)&layout);
                uVar17 = md::ROM::inject_bytes
                                   (rom,&bytes.
                                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                    ,(string *)&blockset_addresses);
                std::__cxx11::string::~string((string *)&blockset_addresses);
                md::ROM::set_long(rom,0xa0a04,uVar17);
                std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                          ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bytes);
                write_maps(world,rom,&map_layout_addresses);
                std::
                _Rb_tree<MapLayout_*,_std::pair<MapLayout_*const,_unsigned_int>,_std::_Select1st<std::pair<MapLayout_*const,_unsigned_int>_>,_std::less<MapLayout_*>,_std::allocator<std::pair<MapLayout_*const,_unsigned_int>_>_>
                ::~_Rb_tree(&map_layout_addresses._M_t);
                return;
              }
              pLVar31 = (LandstalkerException *)__cxa_allocate_exception(0x28);
              std::__cxx11::to_string
                        ((string *)&layout,
                         (unsigned_long)
                         (blockset_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                          .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                          .super__Vector_impl_data._M_finish +
                         (-0x93c - (long)blockset_bytes.
                                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                         .
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &bytes,"New Huffman trees data size is ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &layout);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &blockset_addresses,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &bytes," bytes bigger than the original size");
              LandstalkerException::LandstalkerException(pLVar31,(string *)&blockset_addresses);
              __cxa_throw(pLVar31,&LandstalkerException::typeinfo,
                          LandstalkerException::~LandstalkerException);
            }
            pLVar31 = (LandstalkerException *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&blockset_addresses,
                       "Entity high palettes table must not be bigger than the one from base game",
                       (allocator<char> *)&drop_probabilities);
            LandstalkerException::LandstalkerException(pLVar31,(string *)&blockset_addresses);
            __cxa_throw(pLVar31,&LandstalkerException::typeinfo,
                        LandstalkerException::~LandstalkerException);
          }
          pLVar31 = (LandstalkerException *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&blockset_addresses,
                     "Entity low palettes table must not be bigger than the one from base game",
                     (allocator<char> *)&local_188);
          LandstalkerException::LandstalkerException(pLVar31,(string *)&blockset_addresses);
          __cxa_throw(pLVar31,&LandstalkerException::typeinfo,
                      LandstalkerException::~LandstalkerException);
        }
        bVar14 = ColorPalette<6UL>::is_valid((ColorPalette<6UL> *)&p_Var23[1]._M_parent[1]._M_left);
        if (bVar14) {
          lVar29 = (long)bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
          for (uVar25 = 0;
              uVar30 = ((long)bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start) / 0x18,
              uVar43 = lVar29 / 0x18, uVar25 < uVar30; uVar25 = uVar25 + 1) {
            __one = &std::vector<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_>::at
                               ((vector<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_> *)
                                &bytes,uVar25)->super_array<Color,_6UL>;
            bVar14 = std::operator==(__one,(array<Color,_6UL> *)&p_Var23[1]._M_parent[1]._M_left);
            if (bVar14) {
              uVar30 = ((long)bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start) / 0x18;
              uVar43 = uVar25;
              break;
            }
          }
          if ((uVar43 & 0xff) == uVar30) {
            std::vector<ColorPalette<6ul>,std::allocator<ColorPalette<6ul>>>::
            emplace_back<ColorPalette<6ul>&>
                      ((vector<ColorPalette<6ul>,std::allocator<ColorPalette<6ul>>> *)&bytes,
                       (ColorPalette<6UL> *)&p_Var23[1]._M_parent[1]._M_left);
          }
          ByteArray::add_byte(&blockset_group_bytes,(char)p_Var23[1]._M_color);
          ByteArray::add_byte(&blockset_group_bytes,(byte)uVar43 & 0x7f);
        }
        bVar14 = ColorPalette<7UL>::is_valid
                           ((ColorPalette<7UL> *)&p_Var23[1]._M_parent[2]._M_parent);
        if (bVar14) {
          lVar29 = (long)pMStack_370 - (long)layout;
          lVar34 = 0;
          for (uVar25 = 0; uVar30 = ((long)pMStack_370 - (long)layout) / 0x1c,
              uVar43 = lVar29 / 0x1c, uVar25 < uVar30; uVar25 = uVar25 + 1) {
            bVar14 = std::operator==((array<Color,_7UL> *)(&(layout->_offset).first + lVar34),
                                     (array<Color,_7UL> *)&p_Var23[1]._M_parent[2]._M_parent);
            if (bVar14) {
              uVar30 = ((long)pMStack_370 - (long)layout) / 0x1c;
              uVar43 = uVar25;
              break;
            }
            lVar34 = lVar34 + 0x1c;
          }
          if ((uVar43 & 0xff) == uVar30) {
            std::vector<ColorPalette<7ul>,std::allocator<ColorPalette<7ul>>>::
            emplace_back<ColorPalette<7ul>&>
                      ((vector<ColorPalette<7ul>,std::allocator<ColorPalette<7ul>>> *)&layout,
                       (ColorPalette<7UL> *)&p_Var23[1]._M_parent[2]._M_parent);
          }
          ByteArray::add_byte(&blockset_group_bytes,(char)p_Var23[1]._M_color);
          ByteArray::add_byte(&blockset_group_bytes,(byte)uVar43 | 0x80);
        }
        p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
      } while( true );
    }
    p_Var23 = p_Var21[1]._M_parent;
    blockset = (Blockset *)0x0;
    puStack_280 = (pointer)0x0;
    local_278 = (_Base_ptr)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&blockset_addresses," ",(allocator<char> *)&bytes);
    stringtools::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&layout,(string *)&p_Var23->_M_left,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &blockset_addresses);
    std::__cxx11::string::~string((string *)&blockset_addresses);
    local_340 = pMStack_370;
    uVar35 = _S_red;
    for (pMVar41 = layout; pMVar41 != local_340; pMVar41 = (MapLayout *)&pMVar41->_background_tiles)
    {
      std::__cxx11::string::string
                ((string *)&blockset_addresses,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pMVar41);
      uVar33 = uVar35;
      if ((byte)(uVar35 - 7) < 2) {
        ByteArray::add_byte((ByteArray *)&blockset,'j');
        uVar33 = _S_red;
      }
      cVar36 = uVar33 + _S_black;
      if (uVar33 == _S_red) {
        cVar36 = '\0';
      }
      uVar35 = cVar36 + (char)blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_color;
      if ((byte)uVar35 < 9) {
        if (uVar33 != _S_red) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bytes
                         ," ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &blockset_addresses);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &blockset_addresses,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bytes);
          std::__cxx11::string::~string((string *)&bytes);
        }
        Symbols::bytes_for_symbols
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bytes,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &blockset_addresses);
        ByteArray::add_bytes
                  ((ByteArray *)&blockset,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bytes);
LAB_00190956:
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bytes);
      }
      else {
        if ((ulong)blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ < 9) {
          ByteArray::add_byte((ByteArray *)&blockset,'j');
          uVar35 = (undefined1)
                   blockset_addresses._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
          Symbols::bytes_for_symbols
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bytes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &blockset_addresses);
          ByteArray::add_bytes
                    ((ByteArray *)&blockset,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bytes);
          goto LAB_00190956;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bytes,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &blockset_addresses,0,(ulong)(byte)(7 - uVar33));
        Symbols::bytes_for_symbols
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&blockset_group_bytes,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bytes);
        ByteArray::add_bytes
                  ((ByteArray *)&blockset,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&blockset_group_bytes);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &blockset_group_bytes);
        std::__cxx11::string::~string((string *)&bytes);
        ByteArray::add_byte((ByteArray *)&blockset,'i');
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bytes,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &blockset_addresses,(ulong)(byte)(7 - uVar33),0xffffffffffffffff);
        Symbols::bytes_for_symbols
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&blockset_group_bytes,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bytes);
        ByteArray::add_bytes
                  ((ByteArray *)&blockset,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&blockset_group_bytes);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &blockset_group_bytes);
        uVar35 = bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish._0_1_;
        std::__cxx11::string::~string((string *)&bytes);
      }
      std::__cxx11::string::~string((string *)&blockset_addresses);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&layout);
    ByteArray::add_byte(&blockset_bytes,(char)puStack_280 - (char)blockset);
    ByteArray::add_bytes
              (&blockset_bytes,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&blockset);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&blockset);
    p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21);
  } while( true );
}

Assistant:

void io::write_world_to_rom(World& world, md::ROM& rom)
{
    world.clean_unused_map_palettes();
    world.clean_unused_blocksets();
    world.clean_unused_layouts();

    std::map<MapLayout*, uint32_t> map_layout_addresses = write_map_layouts(world, rom);
    write_blocksets(world, rom);
    write_item_names(world, rom);
    write_items(world, rom);
    write_chest_contents(world, rom);
    write_entity_types(world, rom);
    write_entity_type_palettes(world, rom);
    write_game_strings(world, rom);
    write_map_connections(world, rom);
    write_map_palettes(world, rom);
    write_maps(world, rom, map_layout_addresses);
}